

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

void aes_schedule(cf_aes_context *ctx,uint8_t *key,size_t nkey)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint32_t *puVar8;
  int iVar9;
  ulong uVar10;
  
  uVar10 = nkey >> 2;
  uVar3 = (ulong)(ctx->rounds + 1);
  uVar4 = 0;
  uVar5 = uVar4;
  if (3 < nkey) {
    do {
      uVar6 = *(uint *)(key + uVar4 * 4);
      ctx->ks[uVar4] =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      uVar4 = uVar4 + 1;
      uVar5 = uVar10;
    } while (uVar10 != uVar4);
  }
  lVar7 = uVar5 + uVar3 * -4;
  if (uVar5 < uVar3 * 4) {
    uVar6 = 1;
    uVar3 = 0;
    puVar1 = ctx->ks + (uVar5 - 1);
    do {
      puVar8 = puVar1 + 1;
      uVar2 = *puVar1;
      iVar9 = (int)uVar3;
      if (uVar10 == uVar3) {
        iVar9 = 0;
      }
      uVar6 = (uVar10 == uVar3) + uVar6;
      if (iVar9 == 0) {
        uVar2 = sub_word(uVar2 << 8 | uVar2 >> 0x18,S);
        uVar2 = (uint)Rcon[uVar6] << 0x18 ^ uVar2;
      }
      else if ((0x1b < nkey) && (iVar9 == 4)) {
        uVar2 = sub_word(uVar2,S);
      }
      *puVar8 = uVar2 ^ puVar8[-uVar10];
      uVar3 = (ulong)(iVar9 + 1);
      lVar7 = lVar7 + 1;
      puVar1 = puVar8;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

static void aes_schedule(cf_aes_context *ctx, const uint8_t *key, size_t nkey)
{
  size_t i,
         nb = AES_BLOCKSZ / 4,
         nk = nkey / 4,
         n = nb * (ctx->rounds + 1);
  uint32_t *w = ctx->ks;

  /* First words are just the key. */
  for (i = 0; i < nk; i++)
  {
    w[i] = read32_be(key + i * 4);
  }

  uint32_t i_div_nk = 1;
  uint32_t i_mod_nk = 0;

  for (; i < n; i++, i_mod_nk++)
  {
    uint32_t temp = w[i - 1];
    
    if (i_mod_nk == nk)
    {
      i_div_nk++;
      i_mod_nk = 0;
    }

    if (i_mod_nk == 0)
      temp = sub_word(rot_word(temp), S) ^ round_constant(i_div_nk);
    else if (nk > 6 && i_mod_nk == 4)
      temp = sub_word(temp, S);

    w[i] = w[i - nk] ^ temp;
  }
}